

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O1

int lws_plat_set_socket_options(lws_vhost *vhost,int fd,int unix_skt)

{
  char *__s;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int optval;
  undefined1 local_24 [4];
  
  fcntl(fd,2,1);
  if (unix_skt == 0) {
    if (vhost->ka_time != 0) {
      iVar2 = setsockopt(fd,1,9,local_24,4);
      if (iVar2 < 0) {
        return 1;
      }
      iVar2 = setsockopt(fd,6,0x12,local_24,4);
      if (iVar2 < 0) {
        return 1;
      }
      iVar2 = setsockopt(fd,6,4,local_24,4);
      if (iVar2 < 0) {
        return 1;
      }
      iVar2 = setsockopt(fd,6,5,local_24,4);
      if (iVar2 < 0) {
        return 1;
      }
      iVar2 = setsockopt(fd,6,6,local_24,4);
      if (iVar2 < 0) {
        return 1;
      }
    }
    if ((vhost->bind_iface != 0) && (vhost->iface != (char *)0x0)) {
      _lws_log(8,"binding listen skt to %s using SO_BINDTODEVICE\n");
      __s = vhost->iface;
      sVar3 = strlen(__s);
      iVar2 = setsockopt(fd,1,0x19,__s,(socklen_t)sVar3);
      if (iVar2 < 0) {
        _lws_log(2,"Failed to bind to device %s\n",vhost->iface);
        return 1;
      }
    }
    iVar2 = setsockopt(fd,6,1,local_24,4);
    if (iVar2 < 0) {
      return 1;
    }
  }
  uVar1 = fcntl(fd,4,0x800);
  return uVar1 >> 0x1f;
}

Assistant:

int
lws_plat_set_socket_options(struct lws_vhost *vhost, int fd, int unix_skt)
{
	int optval = 1;
	socklen_t optlen = sizeof(optval);

#if defined(__APPLE__) || \
    defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || \
    defined(__NetBSD__) || \
    defined(__OpenBSD__) || \
    defined(__HAIKU__)
	struct protoent *tcp_proto;
#endif

	(void)fcntl(fd, F_SETFD, FD_CLOEXEC);

	if (!unix_skt && vhost->ka_time) {
		/* enable keepalive on this socket */
		optval = 1;
		if (setsockopt(fd, SOL_SOCKET, SO_KEEPALIVE,
			       (const void *)&optval, optlen) < 0)
			return 1;

#if defined(__APPLE__) || \
    defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || \
    defined(__NetBSD__) || \
    defined(__CYGWIN__) || defined(__OpenBSD__) || defined (__sun) || \
    defined(__HAIKU__)

		/*
		 * didn't find a way to set these per-socket, need to
		 * tune kernel systemwide values
		 */
#else
		/* set the keepalive conditions we want on it too */

#if defined(LWS_HAVE_TCP_USER_TIMEOUT)
		optval = 1000 * (vhost->ka_time +
				 (vhost->ka_interval * vhost->ka_probes));
		if (setsockopt(fd, IPPROTO_TCP, TCP_USER_TIMEOUT,
			       (const void *)&optval, optlen) < 0)
			return 1;
#endif
		optval = vhost->ka_time;
		if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPIDLE,
			       (const void *)&optval, optlen) < 0)
			return 1;

		optval = vhost->ka_interval;
		if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPINTVL,
			       (const void *)&optval, optlen) < 0)
			return 1;

		optval = vhost->ka_probes;
		if (setsockopt(fd, IPPROTO_TCP, TCP_KEEPCNT,
			       (const void *)&optval, optlen) < 0)
			return 1;
#endif
	}

#if defined(SO_BINDTODEVICE)
	if (!unix_skt && vhost->bind_iface && vhost->iface) {
		lwsl_info("binding listen skt to %s using SO_BINDTODEVICE\n", vhost->iface);
		if (setsockopt(fd, SOL_SOCKET, SO_BINDTODEVICE, vhost->iface,
				(socklen_t)strlen(vhost->iface)) < 0) {
			lwsl_warn("Failed to bind to device %s\n", vhost->iface);
			return 1;
		}
	}
#endif

	/* Disable Nagle */
	optval = 1;
#if defined (__sun) || defined(__QNX__)
	if (!unix_skt && setsockopt(fd, IPPROTO_TCP, TCP_NODELAY, (const void *)&optval, optlen) < 0)
		return 1;
#elif !defined(__APPLE__) && \
      !defined(__FreeBSD__) && !defined(__FreeBSD_kernel__) &&        \
      !defined(__NetBSD__) && \
      !defined(__OpenBSD__) && \
      !defined(__HAIKU__)
	if (!unix_skt && setsockopt(fd, SOL_TCP, TCP_NODELAY, (const void *)&optval, optlen) < 0)
		return 1;
#else
	tcp_proto = getprotobyname("TCP");
	if (!unix_skt && setsockopt(fd, tcp_proto->p_proto, TCP_NODELAY, &optval, optlen) < 0)
		return 1;
#endif

	return lws_plat_set_nonblocking(fd);
}